

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_div(sexp ctx,sexp a,sexp b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sexp rat;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp r;
  int bt;
  int at;
  sexp in_stack_ffffffffffffff80;
  sexp in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  sexp ctx_00;
  sexp ctx_01;
  sexp psVar3;
  undefined8 a_00;
  undefined8 local_10;
  
  uVar1 = sexp_number_type(in_RSI);
  uVar2 = sexp_number_type(in_RDX);
  a_00 = &DAT_0000043e;
  psVar3 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  ctx_00 = (sexp)&stack0xffffffffffffffd0;
  ctx_01 = (sexp)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  rat = (sexp)(ulong)(uint)(uVar2 + uVar1 * 6);
  local_10 = in_RSI;
  switch(rat) {
  case (sexp)0x0:
  case (sexp)0x1:
  case (sexp)0x2:
  case (sexp)0x3:
  case (sexp)0x4:
    a_00 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                               (sexp_uint_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (sexp)0x6:
  case (sexp)0xc:
  case (sexp)0x12:
  case (sexp)0x18:
    a_00 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                               (sexp_uint_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (sexp)0x7:
    sexp_make_ratio(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    a_00 = sexp_ratio_normalize(ctx_01,ctx_00,rat);
    break;
  case (sexp)0x8:
    a_00 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0x9:
    sexp_make_ratio(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    a_00 = sexp_ratio_normalize(ctx_01,ctx_00,rat);
    break;
  case (sexp)0xd:
    a_00 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0xe:
    a_00 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0xf:
    sexp_bignum_to_double(in_stack_ffffffffffffff90);
    a_00 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0x10:
    sexp_ratio_to_double(ctx_00,rat);
    a_00 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0x13:
    sexp_make_ratio(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    a_00 = sexp_ratio_normalize(ctx_01,ctx_00,rat);
    break;
  case (sexp)0x14:
    sexp_bignum_to_double(in_stack_ffffffffffffff90);
    a_00 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0x15:
    sexp_make_ratio(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    a_00 = sexp_ratio_normalize(ctx_01,ctx_00,rat);
    break;
  case (sexp)0x19:
  case (sexp)0x1b:
    psVar3 = sexp_make_ratio(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff80);
  case (sexp)0xa:
  case (sexp)0x16:
    if ((((ulong)in_RSI & 3) != 0) || (in_RSI->tag != 0xd)) {
      psVar3 = sexp_make_ratio(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff80);
    }
  case (sexp)0x1c:
    a_00 = sexp_ratio_div(psVar3,ctx_01,ctx_00);
    break;
  case (sexp)0x1a:
    psVar3 = in_RDI;
    sexp_ratio_to_double(ctx_00,rat);
    a_00 = sexp_make_flonum(psVar3,(double)in_stack_ffffffffffffff80);
    break;
  case (sexp)0x22:
    in_stack_ffffffffffffff80 = in_RDI;
    sexp_ratio_to_double(ctx_00,rat);
    sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
  case (sexp)0x1f:
  case (sexp)0x20:
  case (sexp)0x21:
    psVar3 = sexp_make_complex(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff80);
  case (sexp)0x1d:
    local_10 = in_RSI;
    if ((((ulong)in_RSI & 3) == 0) && (local_10 = in_RSI, in_RSI->tag == 0xd)) {
      sexp_ratio_to_double(ctx_00,rat);
      psVar3 = sexp_make_flonum(in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
      local_10 = psVar3;
    }
  case (sexp)0xb:
  case (sexp)0x11:
  case (sexp)0x17:
    if (((local_10 & 3) != 0) || (((sexp)local_10)->tag != 0xe)) {
      psVar3 = sexp_make_complex(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                 in_stack_ffffffffffffff80);
    }
  case (sexp)0x23:
    a_00 = sexp_complex_div((sexp)CONCAT44(uVar1,uVar2),(sexp)a_00,psVar3);
  }
  (in_RDI->value).context.saves = (sexp_gc_var_t *)ctx_01;
  return (sexp)a_00;
}

Assistant:

sexp sexp_div (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
#if ! SEXP_USE_RATIOS
  double f;
#endif
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_NOT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, b);
    break;
  case SEXP_NUM_FIX_FIX:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    f = sexp_fixnum_to_double(a) / sexp_fixnum_to_double(b);
    r = ((f == trunc(f)) ? sexp_make_fixnum((sexp_sint_t)f)
         : sexp_make_flonum(ctx, f));
#endif
    break;
  case SEXP_NUM_FIX_FLO:
    r = sexp_make_flonum(ctx, sexp_fixnum_to_double(a)/sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    r = sexp_make_flonum(ctx, sexp_fixnum_to_double(a)/sexp_bignum_to_double(b));
#endif
    break;
  case SEXP_NUM_FLO_FIX:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a)/sexp_fixnum_to_double(b));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_div(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) / sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_FIX:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
    break;
#else
    b = tmp = sexp_fixnum_to_bignum(ctx, b);
#endif
    /* ... FALLTHROUGH if ! SEXP_USE_RATIOS ... */
  case SEXP_NUM_BIG_BIG:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    r = sexp_bignum_quot_rem(ctx, &tmp, a, b);
    if (sexp_bignum_normalize(tmp) != SEXP_ZERO)
      r = sexp_make_flonum(ctx, sexp_bignum_to_double(a)
                           / sexp_bignum_to_double(b));
    else
      r = sexp_bignum_normalize(r);
#endif
    break;
  case SEXP_NUM_BIG_FLO:
    r = sexp_make_flonum(ctx, sexp_bignum_to_double(a) / sexp_flonum_value(b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) / sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_RAT_FLO:
    r = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a) / sexp_flonum_value(b));
    break;
  case SEXP_NUM_RAT_FIX:
  case SEXP_NUM_RAT_BIG:
    b = tmp = sexp_make_ratio(ctx, b, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    if (!sexp_ratiop(a))
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_div(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_CPX_RAT:
    b = tmp = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, b));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_FIX:
  case SEXP_NUM_CPX_BIG:
    b = tmp = sexp_make_complex(ctx, b, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
    if (sexp_ratiop(a))
      a = tmp = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    if (!sexp_complexp(a))
      a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_div(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}